

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O3

void __thiscall clique_t::clique_t(clique_t *this,index_t _vertex)

{
  iterator __position;
  long local_28;
  
  (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->faces).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->faces).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->faces).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->location = _vertex;
  (this->cofaces)._M_h._M_buckets = &(this->cofaces)._M_h._M_single_bucket;
  (this->cofaces)._M_h._M_bucket_count = 1;
  (this->cofaces)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->cofaces)._M_h._M_element_count = 0;
  (this->cofaces)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->cofaces)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->cofaces)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_28 = _vertex;
  std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
            ((vector<long,std::allocator<long>> *)&this->vertices,(iterator)0x0,&local_28);
  __position._M_current =
       (this->faces).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (__position._M_current ==
      (this->faces).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
              ((vector<long,std::allocator<long>> *)this,__position,&local_28);
  }
  else {
    *__position._M_current = local_28;
    (this->faces).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

clique_t(index_t _vertex) : location(_vertex) {vertices.push_back(_vertex);faces.push_back(_vertex);}